

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O1

int Saig_ManDemiterSimpleDiff_old(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  Aig_Man_t **ppAVar4;
  Aig_Man_t **ppAVar5;
  uint uVar6;
  int iVar7;
  Vec_Ptr_t *vSet;
  void **ppvVar8;
  Vec_Ptr_t *vSet_00;
  Aig_Man_t *pAVar9;
  int iVar10;
  size_t sVar11;
  Aig_Obj_t *pAVar12;
  char *pcVar13;
  ulong uVar14;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *pObj1;
  byte local_50;
  undefined7 uStack_4f;
  Aig_Obj_t *local_48;
  Aig_Man_t **local_40;
  Aig_Man_t **local_38;
  
  iVar7 = p->nTruePos;
  local_40 = ppAig0;
  local_38 = ppAig1;
  vSet = (Vec_Ptr_t *)malloc(0x10);
  iVar10 = 8;
  if (6 < iVar7 - 1U) {
    iVar10 = iVar7;
  }
  vSet->nSize = 0;
  vSet->nCap = iVar10;
  if (iVar10 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar10 * 8);
  }
  vSet->pArray = ppvVar8;
  vSet_00 = (Vec_Ptr_t *)malloc(0x10);
  vSet_00->nSize = 0;
  vSet_00->nCap = iVar10;
  if (iVar10 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar10 << 3);
  }
  vSet_00->pArray = ppvVar8;
  if (0 < p->nTruePos) {
    uVar14 = 0;
    do {
      if ((long)p->vCos->nSize <= (long)uVar14) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p->vCos->pArray[uVar14];
      uVar3 = *(ulong *)((long)pvVar2 + 8);
      pAVar12 = (Aig_Obj_t *)(uVar3 & 0xfffffffffffffffe);
      uVar6 = (uint)*(undefined8 *)&pAVar12->field_0x18;
      if ((uVar6 & 7) == 1) {
        if ((uVar3 & 1) == 0) {
          pcVar13 = "The output number %d of the miter is constant 1.\n";
LAB_0065b2e5:
          printf(pcVar13,uVar14 & 0xffffffff);
        }
      }
      else {
        if (((uVar6 & 7) - 7 < 0xfffffffe) ||
           (iVar7 = Aig_ObjRecognizeExor(pAVar12,(Aig_Obj_t **)&local_50,&local_48),
           pAVar12 = local_48, iVar7 == 0)) {
          pcVar13 = "The output number %d cannot be demitered.\n";
          goto LAB_0065b2e5;
        }
        if ((*(byte *)((long)pvVar2 + 8) & 1) != 0) {
          local_50 = local_50 ^ 1;
        }
        pvVar2 = (void *)CONCAT71(uStack_4f,local_50);
        uVar6 = vSet->nSize;
        uVar1 = vSet->nCap;
        if (*(int *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x24) <
            *(int *)(((ulong)local_48 & 0xfffffffffffffffe) + 0x24)) {
          if (uVar6 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (vSet->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(vSet->pArray,0x80);
              }
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar1 * 2;
              if (iVar7 <= (int)uVar1) goto LAB_0065b394;
              sVar11 = (ulong)uVar1 << 4;
              if (vSet->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(sVar11);
              }
              else {
                ppvVar8 = (void **)realloc(vSet->pArray,sVar11);
              }
            }
            vSet->pArray = ppvVar8;
            vSet->nCap = iVar7;
          }
LAB_0065b394:
          vSet->nSize = uVar6 + 1;
          vSet->pArray[(int)uVar6] = pvVar2;
          pAVar12 = local_48;
        }
        else {
          if (uVar6 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (vSet->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(vSet->pArray,0x80);
              }
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar1 * 2;
              if (iVar7 <= (int)uVar1) goto LAB_0065b3ce;
              sVar11 = (ulong)uVar1 << 4;
              if (vSet->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(sVar11);
              }
              else {
                ppvVar8 = (void **)realloc(vSet->pArray,sVar11);
              }
            }
            vSet->pArray = ppvVar8;
            vSet->nCap = iVar7;
          }
LAB_0065b3ce:
          vSet->nSize = uVar6 + 1;
          vSet->pArray[(int)uVar6] = pAVar12;
          pAVar12 = (Aig_Obj_t *)CONCAT71(uStack_4f,local_50);
        }
        uVar6 = vSet_00->nSize;
        uVar1 = vSet_00->nCap;
        if (uVar6 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (vSet_00->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(vSet_00->pArray,0x80);
            }
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar1 * 2;
            if (iVar7 <= (int)uVar1) goto LAB_0065b44c;
            if (vSet_00->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(vSet_00->pArray,(ulong)uVar1 << 4);
            }
          }
          vSet_00->pArray = ppvVar8;
          vSet_00->nCap = iVar7;
        }
LAB_0065b44c:
        vSet_00->nSize = uVar6 + 1;
        vSet_00->pArray[(int)uVar6] = pAVar12;
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)p->nTruePos);
  }
  ppAVar5 = local_38;
  ppAVar4 = local_40;
  if (local_40 != (Aig_Man_t **)0x0) {
    pAVar9 = Aig_ManDupNodesAll(p,vSet);
    *ppAVar4 = pAVar9;
    if (pAVar9->pName != (char *)0x0) {
      free(pAVar9->pName);
      (*ppAVar4)->pName = (char *)0x0;
    }
    pcVar13 = (char *)malloc(6);
    builtin_strncpy(pcVar13,"part0",6);
    (*ppAVar4)->pName = pcVar13;
  }
  if (ppAVar5 != (Aig_Man_t **)0x0) {
    pAVar9 = Aig_ManDupNodesAll(p,vSet_00);
    *ppAVar5 = pAVar9;
    if (pAVar9->pName != (char *)0x0) {
      free(pAVar9->pName);
      (*ppAVar5)->pName = (char *)0x0;
    }
    pcVar13 = (char *)malloc(6);
    builtin_strncpy(pcVar13,"part1",6);
    (*ppAVar5)->pName = pcVar13;
  }
  if (vSet->pArray != (void **)0x0) {
    free(vSet->pArray);
    vSet->pArray = (void **)0x0;
  }
  free(vSet);
  if (vSet_00->pArray != (void **)0x0) {
    free(vSet_00->pArray);
    vSet_00->pArray = (void **)0x0;
  }
  free(vSet_00);
  return 1;
}

Assistant:

int Saig_ManDemiterSimpleDiff_old( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pFanin, * pObj0, * pObj1;
    int i, Counter = 0;
//    assert( Saig_ManRegNum(p) % 2 == 0 );
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1( pFanin ) )
        {
            if ( !Aig_ObjFaninC0(pObj) )
                printf( "The output number %d of the miter is constant 1.\n", i );
            Counter++;
            continue;
        } 
        if ( !Aig_ObjIsNode(pFanin) || !Aig_ObjRecognizeExor( pFanin, &pObj0, &pObj1 ) )
        {
/*
            printf( "The miter cannot be demitered.\n" );
            Vec_PtrFree( vSet0 );
            Vec_PtrFree( vSet1 );
            return 0;
*/
            printf( "The output number %d cannot be demitered.\n", i );
            continue;
        }
        if ( Aig_ObjFaninC0(pObj) )
            pObj0 = Aig_Not(pObj0);

//        printf( "%d %d  ", Aig_Regular(pObj0)->Id, Aig_Regular(pObj1)->Id );
        if ( Aig_Regular(pObj0)->Id < Aig_Regular(pObj1)->Id )
        {
            Vec_PtrPush( vSet0, pObj0 );
            Vec_PtrPush( vSet1, pObj1 );
        }
        else
        {
            Vec_PtrPush( vSet0, pObj1 );
            Vec_PtrPush( vSet1, pObj0 );
        }
    }
//    printf( "Miter has %d constant outputs.\n", Counter );
//    printf( "\n" );
    if ( ppAig0 )
    {
        *ppAig0 = Aig_ManDupNodesAll( p, vSet0 );
        ABC_FREE( (*ppAig0)->pName );
        (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    }
    if ( ppAig1 )
    {
        *ppAig1 = Aig_ManDupNodesAll( p, vSet1 );
        ABC_FREE( (*ppAig1)->pName );
        (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    }
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    return 1;
}